

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Company.cpp
# Opt level: O1

void __thiscall Company::~Company(Company *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Employee *pEVar2;
  pointer pcVar3;
  Boss *pBVar4;
  int iVar5;
  long lVar6;
  
  lVar6 = 0;
  while( true ) {
    iVar5 = Boss::getNumberOfEmployees(this->boss);
    if (iVar5 <= lVar6) break;
    pEVar2 = this->employees[lVar6];
    if (pEVar2 != (Employee *)0x0) {
      (pEVar2->super_Person)._vptr_Person = (_func_int **)&PTR_validate_00109d98;
      pcVar3 = (pEVar2->super_Person).address.street._M_dataplus._M_p;
      paVar1 = &(pEVar2->super_Person).address.street.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != paVar1) {
        operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
      }
      pcVar3 = (pEVar2->super_Person).address.city._M_dataplus._M_p;
      paVar1 = &(pEVar2->super_Person).address.city.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != paVar1) {
        operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
      }
      pcVar3 = (pEVar2->super_Person).address.country._M_dataplus._M_p;
      paVar1 = &(pEVar2->super_Person).address.country.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != paVar1) {
        operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
      }
      pcVar3 = (pEVar2->super_Person).id._M_dataplus._M_p;
      paVar1 = &(pEVar2->super_Person).id.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != paVar1) {
        operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
      }
      pcVar3 = (pEVar2->super_Person).name._M_dataplus._M_p;
      paVar1 = &(pEVar2->super_Person).name.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != paVar1) {
        operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
      }
      operator_delete(pEVar2,0xb8);
    }
    lVar6 = lVar6 + 1;
  }
  if (this->employees != (Employee **)0x0) {
    operator_delete__(this->employees);
  }
  pBVar4 = this->boss;
  if (pBVar4 != (Boss *)0x0) {
    (pBVar4->super_Employee).super_Person._vptr_Person = (_func_int **)&PTR_validate_00109d98;
    pcVar3 = (pBVar4->super_Employee).super_Person.address.street._M_dataplus._M_p;
    paVar1 = &(pBVar4->super_Employee).super_Person.address.street.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    pcVar3 = (pBVar4->super_Employee).super_Person.address.city._M_dataplus._M_p;
    paVar1 = &(pBVar4->super_Employee).super_Person.address.city.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    pcVar3 = (pBVar4->super_Employee).super_Person.address.country._M_dataplus._M_p;
    paVar1 = &(pBVar4->super_Employee).super_Person.address.country.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    pcVar3 = (pBVar4->super_Employee).super_Person.id._M_dataplus._M_p;
    paVar1 = &(pBVar4->super_Employee).super_Person.id.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    pcVar3 = (pBVar4->super_Employee).super_Person.name._M_dataplus._M_p;
    paVar1 = &(pBVar4->super_Employee).super_Person.name.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    operator_delete(pBVar4,0xc0);
    return;
  }
  return;
}

Assistant:

Company::~Company() {
    // delete memory of all of the employees and boss
    for (int i = 0; i < boss->getNumberOfEmployees(); ++i) {
        delete employees[i];
    }
    delete[] employees;
    delete boss;
}